

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_3dm_settings.cpp
# Opt level: O0

void __thiscall
ON_3dmAnnotationSettings::Internal_CopyFrom
          (ON_3dmAnnotationSettings *this,ON_3dmAnnotationSettings *src)

{
  ON_3dmAnnotationSettingsPrivate *pOVar1;
  float fVar2;
  undefined3 uVar3;
  uint uVar4;
  unsigned_short uVar5;
  uchar uVar6;
  uchar uVar7;
  uchar uVar8;
  uchar uVar9;
  ON_3dmAnnotationSettingsPrivate *pOVar10;
  ON_3dmAnnotationSettings *src_local;
  ON_3dmAnnotationSettings *this_local;
  
  this->m_dimscale = src->m_dimscale;
  this->m_textheight = src->m_textheight;
  this->m_dimexe = src->m_dimexe;
  this->m_dimexo = src->m_dimexo;
  this->m_arrowlength = src->m_arrowlength;
  this->m_arrowwidth = src->m_arrowwidth;
  this->m_centermark = src->m_centermark;
  this->m_b_V5_EnableAnnotationScaling = src->m_b_V5_EnableAnnotationScaling;
  this->m_bEnableModelSpaceAnnotationScaling = src->m_bEnableModelSpaceAnnotationScaling;
  this->m_bEnableLayoutSpaceAnnotationScaling = src->m_bEnableLayoutSpaceAnnotationScaling;
  this->m_bEnableHatchScaling = src->m_bEnableHatchScaling;
  this->m_reserved1 = src->m_reserved1;
  this->m_reserved2 = src->m_reserved2;
  this->m_reserved3 = src->m_reserved3;
  this->m_reserved4 = src->m_reserved4;
  this->m_dimunits = src->m_dimunits;
  this->m_arrowtype = src->m_arrowtype;
  this->m_angularunits = src->m_angularunits;
  this->m_lengthformat = src->m_lengthformat;
  this->m_angleformat = src->m_angleformat;
  this->m_resolution = src->m_resolution;
  ON_wString::operator=(&this->m_facename,&src->m_facename);
  if (src->m_private != (ON_3dmAnnotationSettingsPrivate *)0x0) {
    pOVar10 = (ON_3dmAnnotationSettingsPrivate *)operator_new(0x1c);
    memset(pOVar10,0,0x1c);
    ON_3dmAnnotationSettingsPrivate::ON_3dmAnnotationSettingsPrivate(pOVar10);
    this->m_private = pOVar10;
    pOVar10 = src->m_private;
    pOVar1 = this->m_private;
    fVar2 = pOVar10->m_world_view_hatch_scale;
    pOVar1->m_world_view_text_scale = pOVar10->m_world_view_text_scale;
    pOVar1->m_world_view_hatch_scale = fVar2;
    uVar3 = *(undefined3 *)&pOVar10->field_0x9;
    uVar4 = (pOVar10->m_dimension_layer_id).Data1;
    pOVar1->m_use_dimension_layer = pOVar10->m_use_dimension_layer;
    *(undefined3 *)&pOVar1->field_0x9 = uVar3;
    (pOVar1->m_dimension_layer_id).Data1 = uVar4;
    uVar5 = (pOVar10->m_dimension_layer_id).Data3;
    uVar6 = (pOVar10->m_dimension_layer_id).Data4[0];
    uVar7 = (pOVar10->m_dimension_layer_id).Data4[1];
    uVar8 = (pOVar10->m_dimension_layer_id).Data4[2];
    uVar9 = (pOVar10->m_dimension_layer_id).Data4[3];
    (pOVar1->m_dimension_layer_id).Data2 = (pOVar10->m_dimension_layer_id).Data2;
    (pOVar1->m_dimension_layer_id).Data3 = uVar5;
    (pOVar1->m_dimension_layer_id).Data4[0] = uVar6;
    (pOVar1->m_dimension_layer_id).Data4[1] = uVar7;
    (pOVar1->m_dimension_layer_id).Data4[2] = uVar8;
    (pOVar1->m_dimension_layer_id).Data4[3] = uVar9;
    *(undefined4 *)((pOVar1->m_dimension_layer_id).Data4 + 4) =
         *(undefined4 *)((pOVar10->m_dimension_layer_id).Data4 + 4);
  }
  return;
}

Assistant:

void ON_3dmAnnotationSettings::Internal_CopyFrom(const ON_3dmAnnotationSettings& src)
{
  m_dimscale = src.m_dimscale;
  m_textheight = src.m_textheight;
  m_dimexe = src.m_dimexe;
  m_dimexo = src.m_dimexo;
  m_arrowlength = src.m_arrowlength;
  m_arrowwidth = src.m_arrowwidth;
  m_centermark = src.m_centermark;
  
  m_b_V5_EnableAnnotationScaling = src.m_b_V5_EnableAnnotationScaling;
  m_bEnableModelSpaceAnnotationScaling = src.m_bEnableModelSpaceAnnotationScaling;
  m_bEnableLayoutSpaceAnnotationScaling = src.m_bEnableLayoutSpaceAnnotationScaling;
  m_bEnableHatchScaling = src.m_bEnableHatchScaling;
  
  m_reserved1 = src.m_reserved1;
  m_reserved2 = src.m_reserved2;
  m_reserved3 = src.m_reserved3;
  m_reserved4 = src.m_reserved4;
  
  m_dimunits = src.m_dimunits;
  m_arrowtype = src.m_arrowtype;
  m_angularunits = src.m_angularunits;
  m_lengthformat = src.m_lengthformat;
  m_angleformat = src.m_angleformat;
  m_resolution = src.m_resolution;
  m_facename = src.m_facename;

  if (src.m_private)
  {
    m_private = new ON_3dmAnnotationSettingsPrivate();
    *m_private = *src.m_private;
  }
}